

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

void fert_stats<dynet::AttentionalModel<dynet::LSTMBuilder>>
               (Model *model,AttentionalModel<dynet::LSTMBuilder> *am,Corpus *devel,bool global_fert
               )

{
  byte bVar1;
  size_type sVar2;
  ostream *poVar3;
  byte in_CL;
  vector<int,_std::allocator<int>_> *in_RDX;
  AttentionalModel<dynet::LSTMBuilder> *in_RSI;
  uint i_1;
  uint i;
  int docid;
  Sentence tsent;
  Sentence ssent;
  Dict *in_stack_000001f0;
  vector<int,_std::allocator<int>_> *in_stack_000001f8;
  AttentionalModel<dynet::LSTMBuilder> *in_stack_00000200;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  *in_stack_fffffffffffffee8;
  ostream *in_stack_fffffffffffffef0;
  ostream *in_stack_fffffffffffffef8;
  ostream *in_stack_ffffffffffffff00;
  uint local_84;
  uint local_68;
  int local_54;
  Dict *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x196ea7);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x196eb4);
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"==== FERTILITY ESTIMATES ====\n");
    for (local_68 = 0;
        sVar2 = std::
                vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::size((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                        *)in_RDX), local_68 < sVar2; local_68 = local_68 + 1) {
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::operator[]((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                    *)in_RDX,(ulong)local_68);
      std::tie<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
                 (int *)in_stack_fffffffffffffee8);
      std::tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>::
      operator=((tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int_&>
                 *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      poVar3 = std::operator<<((ostream *)&std::cout,"=== sentence ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_68);
      poVar3 = std::operator<<(poVar3," (");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_54);
      std::operator<<(poVar3,") ===\n");
      dynet::AttentionalModel<dynet::LSTMBuilder>::display_fertility
                (in_stack_00000200,in_stack_000001f8,in_stack_000001f0);
    }
  }
  std::operator<<((ostream *)&std::cout,"==== EMPIRICAL FERTILITY VALUES ====\n");
  for (local_84 = 0;
      sVar2 = std::
              vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
              ::size((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                      *)in_RDX), local_84 < sVar2; local_84 = local_84 + 1) {
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::operator[]((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                  *)in_RDX,(ulong)local_84);
    std::tie<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef8,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffef0,
               (int *)in_stack_fffffffffffffee8);
    std::tuple<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int&>::
    operator=((tuple<std::vector<int,_std::allocator<int>_>_&,_std::vector<int,_std::allocator<int>_>_&,_int_&>
               *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    poVar3 = std::operator<<((ostream *)&std::cout,"=== sentence ");
    in_stack_ffffffffffffff00 = (ostream *)std::ostream::operator<<(poVar3,local_84);
    in_stack_fffffffffffffef8 = std::operator<<(in_stack_ffffffffffffff00," (");
    in_stack_fffffffffffffef0 =
         (ostream *)std::ostream::operator<<(in_stack_fffffffffffffef8,local_54);
    std::operator<<(in_stack_fffffffffffffef0,") ===\n");
    dynet::AttentionalModel<dynet::LSTMBuilder>::display_empirical_fertility
              (in_RSI,in_RDX,
               (vector<int,_std::allocator<int>_> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00);
  return;
}

Assistant:

void fert_stats(Model &model, AM_t &am, Corpus &devel, bool global_fert)
{
    Sentence ssent, tsent;
    int docid;

    if (global_fert) {
        std::cout << "==== FERTILITY ESTIMATES ====\n";
        for (unsigned i = 0; i < devel.size(); ++i) {
            tie(ssent, tsent, docid) = devel[i];
            std::cout << "=== sentence " << i << " (" << docid << ") ===\n";
            am.display_fertility(ssent, sd);
        }
    }

    std::cout << "==== EMPIRICAL FERTILITY VALUES ====\n";
    for (unsigned i = 0; i < devel.size(); ++i) {
        tie(ssent, tsent, docid) = devel[i];
        std::cout << "=== sentence " << i << " (" << docid << ") ===\n";
        am.display_empirical_fertility(ssent, tsent, sd);
    }
}